

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O3

uint xSAT_SolverPropagate(xSAT_Solver_t *s)

{
  iword *piVar1;
  xSAT_Watcher_t *pxVar2;
  xSAT_VecWatchList_t *pxVar3;
  xSAT_WatchList_t *pxVar4;
  Vec_Str_t *pVVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  xSAT_Watcher_t *pxVar10;
  Vec_Int_t *pVVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uint *puVar15;
  uint uVar16;
  uint *puVar17;
  uint uVar18;
  xSAT_Watcher_t *pxVar19;
  uint uVar20;
  ulong uVar21;
  xSAT_WatchList_t *pxVar22;
  int iVar23;
  xSAT_Watcher_t *pxVar24;
  xSAT_Watcher_t xVar25;
  uint local_5c;
  int local_50;
  
  uVar7 = s->iQhead;
  pVVar11 = s->vTrail;
  uVar21 = 0;
  if ((int)uVar7 < pVVar11->nSize) {
    local_5c = 0xffffffff;
    do {
      s->iQhead = uVar7 + 1;
      if ((int)uVar7 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar7 = pVVar11->pArray[uVar7];
      pxVar3 = s->vBinWatches;
      if (pxVar3->nCap <= (int)uVar7) {
LAB_009052cc:
        __assert_fail("iEntry < v->nCap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatWatchList.h"
                      ,0x106,"xSAT_WatchList_t *xSAT_VecWatchListEntry(xSAT_VecWatchList_t *, int)")
        ;
      }
      if (pxVar3->nSize <= (int)uVar7) {
LAB_009052eb:
        __assert_fail("iEntry < v->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatWatchList.h"
                      ,0x107,"xSAT_WatchList_t *xSAT_VecWatchListEntry(xSAT_VecWatchList_t *, int)")
        ;
      }
      lVar12 = (long)pxVar3->pArray[(int)uVar7].nSize;
      if (0 < lVar12) {
        pxVar24 = pxVar3->pArray[(int)uVar7].pArray;
        pxVar19 = pxVar24 + lVar12;
        do {
          uVar20 = pxVar24->Blocker;
          uVar8 = (int)uVar20 >> 1;
          if (((int)uVar8 < 0) || (s->vAssigns->nSize <= (int)uVar8)) goto LAB_0090528e;
          uVar8 = (uint)s->vAssigns->pArray[uVar8];
          if (uVar8 == 3) {
            xSAT_SolverEnqueue(s,uVar20,pxVar24->CRef);
          }
          else if ((uVar20 & 1 ^ uVar8) == 1) {
            return pxVar24->CRef;
          }
          pxVar24 = pxVar24 + 1;
        } while (pxVar24 < pxVar19);
      }
      pxVar3 = s->vWatches;
      if (pxVar3->nCap <= (int)uVar7) goto LAB_009052cc;
      if (pxVar3->nSize <= (int)uVar7) goto LAB_009052eb;
      pxVar4 = pxVar3->pArray;
      pxVar19 = pxVar4[(int)uVar7].pArray;
      iVar9 = pxVar4[(int)uVar7].nSize;
      pxVar24 = pxVar19;
      if (0 < (long)iVar9) {
        pxVar2 = pxVar19 + iVar9;
        uVar20 = uVar7 ^ 1;
        do {
          uVar8 = pxVar19->Blocker >> 1;
          if (((int)uVar8 < 0) || (pVVar5 = s->vAssigns, pVVar5->nSize <= (int)uVar8))
          goto LAB_0090528e;
          pcVar6 = pVVar5->pArray;
          if ((pxVar19->Blocker & 1U) == (int)pcVar6[uVar8]) {
            *pxVar24 = *pxVar19;
            pxVar24 = pxVar24 + 1;
          }
          else {
            if ((long)(int)pxVar19->CRef == -1) {
              puVar15 = (uint *)0x0;
            }
            else {
              puVar15 = s->pMemory->pData + (int)pxVar19->CRef;
            }
            uVar14 = puVar15[2];
            uVar8 = puVar15[3];
            if (uVar14 == uVar20) {
              puVar15[2] = uVar8;
              puVar15[3] = uVar20;
              uVar14 = uVar8;
            }
            else if (uVar8 != uVar20) {
              __assert_fail("Lits[1] == NegLit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatSolver.c"
                            ,0x2c9,"unsigned int xSAT_SolverPropagate(xSAT_Solver_t *)");
            }
            uVar8 = pxVar19->CRef;
            if (uVar14 != pxVar19->Blocker) {
              uVar16 = (int)uVar14 >> 1;
              if (((int)uVar16 < 0) || (pVVar5->nSize <= (int)uVar16)) goto LAB_0090528e;
              if ((uVar14 & 1) == (int)pcVar6[uVar16]) {
                pxVar24->CRef = uVar8;
                pxVar24->Blocker = uVar14;
                pxVar24 = pxVar24 + 1;
                goto LAB_00905203;
              }
            }
            if (2 < (long)(int)puVar15[1]) {
              puVar17 = puVar15 + 4;
              do {
                uVar16 = *puVar17;
                uVar18 = (int)uVar16 >> 1;
                if (((int)uVar18 < 0) || (pVVar5->nSize <= (int)uVar18)) goto LAB_0090528e;
                if ((uVar16 & 1 ^ (int)pcVar6[uVar18]) != 1) {
                  puVar15[3] = uVar16;
                  *puVar17 = uVar20;
                  pxVar3 = s->vWatches;
                  iVar9 = (int)((long)(int)puVar15[3] ^ 1U);
                  if (pxVar3->nCap <= iVar9) goto LAB_009052cc;
                  if (pxVar3->nSize <= iVar9) goto LAB_009052eb;
                  if (pxVar3->pArray == (xSAT_WatchList_t *)0x0) {
                    __assert_fail("v",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatWatchList.h"
                                  ,0x78,
                                  "void xSAT_WatchListPush(xSAT_WatchList_t *, xSAT_Watcher_t)");
                  }
                  pxVar22 = pxVar3->pArray + ((long)(int)puVar15[3] ^ 1U);
                  uVar16 = pxVar22->nSize;
                  if (uVar16 == pxVar22->nCap) {
                    uVar13 = (ulong)((uVar16 >> 1) * 3);
                    if ((int)uVar16 < 4) {
                      uVar13 = 4;
                    }
                    if (pxVar22->pArray == (xSAT_Watcher_t *)0x0) {
                      pxVar10 = (xSAT_Watcher_t *)malloc(uVar13 * 8);
                    }
                    else {
                      pxVar10 = (xSAT_Watcher_t *)realloc(pxVar22->pArray,uVar13 * 8);
                    }
                    pxVar22->pArray = pxVar10;
                    local_50 = (int)uVar13;
                    if (pxVar10 == (xSAT_Watcher_t *)0x0) {
                      printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                             (double)pxVar22->nCap * 9.5367431640625e-07,
                             (double)local_50 * 9.5367431640625e-07);
                      fflush(_stdout);
                    }
                    pxVar22->nCap = local_50;
                    uVar16 = pxVar22->nSize;
                  }
                  xVar25.Blocker = uVar14;
                  xVar25.CRef = uVar8;
                  pxVar22->nSize = uVar16 + 1;
                  pxVar22->pArray[(int)uVar16] = xVar25;
                  goto LAB_00905203;
                }
                puVar17 = puVar17 + 1;
              } while (puVar17 < puVar15 + (long)(int)puVar15[1] + 2);
            }
            pxVar24->CRef = uVar8;
            pxVar24->Blocker = uVar14;
            uVar8 = puVar15[2];
            uVar14 = (int)uVar8 >> 1;
            if (((int)uVar14 < 0) || (pVVar5->nSize <= (int)uVar14)) {
LAB_0090528e:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                            ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
            }
            pxVar24 = pxVar24 + 1;
            uVar16 = pxVar19->CRef;
            if ((uVar8 & 1 ^ (int)pcVar6[uVar14]) == 1) {
              s->iQhead = s->vTrail->nSize;
              while (pxVar19 = pxVar19 + 1, local_5c = uVar16, pxVar19 < pxVar2) {
                *pxVar24 = *pxVar19;
                pxVar24 = pxVar24 + 1;
              }
            }
            else {
              xSAT_SolverEnqueue(s,uVar8,uVar16);
            }
          }
LAB_00905203:
          pxVar19 = pxVar19 + 1;
        } while (pxVar19 < pxVar2);
        pxVar19 = pxVar4[(int)uVar7].pArray;
        iVar9 = pxVar4[(int)uVar7].nSize;
      }
      piVar1 = &(s->Stats).nInspects;
      *piVar1 = *piVar1 + ((long)pxVar24 - (long)pxVar19 >> 3);
      iVar23 = (int)((ulong)((long)pxVar24 - (long)pxVar19) >> 3);
      if (iVar9 < iVar23) {
        __assert_fail("k <= v->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatWatchList.h"
                      ,0x67,"void xSAT_WatchListShrink(xSAT_WatchList_t *, int)");
      }
      uVar20 = (int)uVar21 + 1;
      uVar21 = (ulong)uVar20;
      pxVar4[(int)uVar7].nSize = iVar23;
      uVar7 = s->iQhead;
      pVVar11 = s->vTrail;
    } while ((int)uVar7 < pVVar11->nSize);
    uVar21 = (ulong)uVar20;
  }
  else {
    local_5c = 0xffffffff;
  }
  piVar1 = &(s->Stats).nPropagations;
  *piVar1 = *piVar1 + uVar21;
  s->nPropSimplify = s->nPropSimplify - uVar21;
  return local_5c;
}

Assistant:

unsigned xSAT_SolverPropagate( xSAT_Solver_t* s )
{
    unsigned hConfl = CRefUndef;
    int * Lits;
    int NegLit;
    int nProp = 0;

    while ( s->iQhead < Vec_IntSize( s->vTrail ) )
    {
        int p = Vec_IntEntry( s->vTrail, s->iQhead++ );
        xSAT_WatchList_t* ws = xSAT_VecWatchListEntry( s->vBinWatches, p );
        xSAT_Watcher_t* begin = xSAT_WatchListArray( ws );
        xSAT_Watcher_t* end   = begin + xSAT_WatchListSize( ws );
        xSAT_Watcher_t *i, *j;

        nProp++;
        for ( i = begin; i < end; i++ )
        {
            if ( Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( i->Blocker ) ) == VarX )
                xSAT_SolverEnqueue( s, i->Blocker, i->CRef );
            else if ( Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( i->Blocker ) ) == xSAT_LitSign( xSAT_NegLit( i->Blocker ) ) )
                return i->CRef;
        }

        ws    = xSAT_VecWatchListEntry( s->vWatches, p );
        begin = xSAT_WatchListArray( ws );
        end   = begin + xSAT_WatchListSize( ws );

        for ( i = j = begin; i < end; )
        {
            xSAT_Clause_t * pCla;
            xSAT_Watcher_t w;
            if ( Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( i->Blocker ) ) == xSAT_LitSign( i->Blocker ) )
            {
                *j++ = *i++;
                continue;
            }

            pCla = xSAT_SolverReadClause( s, i->CRef );
            Lits = &( pCla->pData[0].Lit );

            // Make sure the false literal is data[1]:
            NegLit = xSAT_NegLit( p );
            if ( Lits[0] == NegLit )
            {
                Lits[0] = Lits[1];
                Lits[1] = NegLit;
            }
            assert( Lits[1] == NegLit );

            w.CRef = i->CRef;
            w.Blocker = Lits[0];

            // If 0th watch is true, then clause is already satisfied.
            if ( Lits[0] != i->Blocker && Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( Lits[0] ) ) == xSAT_LitSign( Lits[0] ) )
                *j++ = w;
            else
            {
                // Look for new watch:
                int * stop = Lits + pCla->nSize;
                int * k;
                for ( k = Lits + 2; k < stop; k++ )
                {
                    if (Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( *k ) ) != !xSAT_LitSign( *k ) )
                    {
                        Lits[1] = *k;
                        *k = NegLit;
                        xSAT_WatchListPush( xSAT_VecWatchListEntry( s->vWatches, xSAT_NegLit( Lits[1] ) ), w );
                        goto next;
                    }
                }

                *j++ = w;

                // Clause is unit under assignment:
                if (Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( Lits[0] ) ) == xSAT_LitSign( xSAT_NegLit( Lits[0] ) ) )
                {
                    hConfl = i->CRef;
                    i++;
                    s->iQhead = Vec_IntSize( s->vTrail );
                    // Copy the remaining watches:
                    while (i < end)
                        *j++ = *i++;
                }
                else
                    xSAT_SolverEnqueue( s, Lits[0], i->CRef );
            }
        next:
            i++;
        }

        s->Stats.nInspects += j - xSAT_WatchListArray( ws );
        xSAT_WatchListShrink( ws, j - xSAT_WatchListArray( ws ) );
    }

    s->Stats.nPropagations += nProp;
    s->nPropSimplify -= nProp;

    return hConfl;
}